

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  uint uVar1;
  lua_Unsigned lVar2;
  Value VVar3;
  Table *local_60;
  Table *local_58;
  TValue *io_2;
  TValue *io_1;
  TValue *io;
  Table *h;
  TValue *tm;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  uVar1 = rb->tt_ & 0x3f;
  if (uVar1 == 4) {
    VVar3.i._1_7_ = 0;
    VVar3.b._0_1_ = (rb->value_).f[0xb];
    ra->value_ = VVar3;
    ra->tt_ = 0x13;
  }
  else {
    if (uVar1 == 5) {
      t = (Table *)(rb->value_).gc;
      if (t->metatable == (Table *)0x0) {
        local_58 = (Table *)0x0;
      }
      else {
        if ((t->metatable->flags & 0x10) == 0) {
          local_60 = (Table *)luaT_gettm(t->metatable,TM_LEN,L->l_G->tmname[4]);
        }
        else {
          local_60 = (Table *)0x0;
        }
        local_58 = local_60;
      }
      h = local_58;
      if (local_58 == (Table *)0x0) {
        lVar2 = luaH_getn(t);
        (ra->value_).i = lVar2;
        ra->tt_ = 0x13;
        return;
      }
    }
    else {
      if (uVar1 == 0x14) {
        ra->value_ = *(Value *)((rb->value_).f + 0x10);
        ra->tt_ = 0x13;
        return;
      }
      h = (Table *)luaT_gettmbyobj(L,rb,TM_LEN);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,rb,"get length of");
      }
    }
    luaT_callTM(L,(TValue *)h,rb,rb,ra,1);
  }
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttype(rb)) {
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(ra, luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_TSHRSTR: {
      setivalue(ra, tsvalue(rb)->shrlen);
      return;
    }
    case LUA_TLNGSTR: {
      setivalue(ra, tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (ttisnil(tm))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTM(L, tm, rb, rb, ra, 1);
}